

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

void __thiscall Graph<Node>::printConnectedComponents(Graph<Node> *this,ofstream *fout)

{
  vector<int> *pvVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"Connected components in current graph:\n\n",0x28);
  if (0 < (this->compList)._size) {
    lVar4 = 0;
    do {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)fout,(int)lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      pvVar1 = (this->compList).vect;
      if (0 < pvVar1[lVar4]._size) {
        lVar3 = 0;
        do {
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)fout,pvVar1[lVar4].vect[lVar3]);
          uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,(char *)((long)&uStack_38 + 7),1);
          lVar3 = lVar3 + 1;
          pvVar1 = (this->compList).vect;
        } while (lVar3 < pvVar1[lVar4]._size);
      }
      uStack_38._0_7_ = CONCAT16(10,(undefined6)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)fout,(char *)((long)&uStack_38 + 6),1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->compList)._size);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"------------------------\n\n",0x1a);
  return;
}

Assistant:

void printConnectedComponents(std::ofstream &fout) {
        fout << "Connected components in current graph:\n\n";
        for (int i = 0; i < compList.size(); ++i) {
            fout << i << ": ";
            for (int j = 0; j < compList[i].size(); ++j) {
                fout << compList[i][j] << ' ';
            }
            fout << '\n';
        }

        fout << "------------------------\n\n";
    }